

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void printsub(SessionHandle *data,int direction,uchar *pointer,size_t length)

{
  uchar uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  char *pcVar5;
  int j;
  unsigned_short *pval;
  size_t sStack_28;
  uint i;
  size_t length_local;
  uchar *pointer_local;
  int direction_local;
  SessionHandle *data_local;
  
  pval._4_4_ = 0;
  if (((data->set).verbose & 1U) != 0) {
    sStack_28 = length;
    if (direction != 0) {
      pcVar5 = "SENT";
      if (direction == 0x3c) {
        pcVar5 = "RCVD";
      }
      Curl_infof(data,"%s IAC SB ",pcVar5);
      if (2 < length) {
        pval._4_4_ = (uint)pointer[length - 2];
        uVar4 = (uint)pointer[length - 1];
        if ((pval._4_4_ != 0xff) || (uVar4 != 0xf0)) {
          Curl_infof(data,"(terminated by ");
          if (pval._4_4_ < 0x28) {
            Curl_infof(data,"%s ",telnetoptions[pval._4_4_]);
          }
          else if ((pval._4_4_ < 0xec) || (0xff < pval._4_4_)) {
            Curl_infof(data,"%u ",(ulong)pval._4_4_);
          }
          else {
            Curl_infof(data,"%s ",telnetcmds[pval._4_4_ - 0xec]);
          }
          if (uVar4 < 0x28) {
            Curl_infof(data,"%s",telnetoptions[(int)uVar4]);
          }
          else if ((uVar4 < 0xec) || (0xff < uVar4)) {
            Curl_infof(data,"%d",(ulong)uVar4);
          }
          else {
            Curl_infof(data,"%s",telnetcmds[(int)(uVar4 - 0xec)]);
          }
          Curl_infof(data,", not IAC SE!) ");
        }
      }
      sStack_28 = length - 2;
    }
    if (sStack_28 == 0) {
      Curl_infof(data,"(Empty suboption?)");
    }
    else {
      if (*pointer < 0x28) {
        uVar1 = *pointer;
        if ((((uVar1 == '\x18') || (uVar1 == '\x1f')) || (uVar1 == '#')) || (uVar1 == '\'')) {
          Curl_infof(data,"%s",telnetoptions[*pointer]);
        }
        else {
          Curl_infof(data,"%s (unsupported)",telnetoptions[*pointer]);
        }
      }
      else {
        Curl_infof(data,"%d (unknown)",(ulong)pointer[pval._4_4_]);
      }
      if (*pointer == '\x1f') {
        uVar2 = ntohs(*(uint16_t *)(pointer + 1));
        uVar3 = ntohs(*(uint16_t *)(pointer + 3));
        Curl_infof(data,"Width: %hu ; Height: %hu",(ulong)uVar2,(ulong)uVar3);
      }
      else {
        switch(pointer[1]) {
        case '\0':
          Curl_infof(data," IS");
          break;
        case '\x01':
          Curl_infof(data," SEND");
          break;
        case '\x02':
          Curl_infof(data," INFO/REPLY");
          break;
        case '\x03':
          Curl_infof(data," NAME");
        }
        uVar1 = *pointer;
        if ((uVar1 == '\x18') || (uVar1 == '#')) {
          pointer[sStack_28] = '\0';
          Curl_infof(data," \"%s\"",pointer + 2);
        }
        else if (uVar1 == '\'') {
          if (pointer[1] == '\0') {
            Curl_infof(data," ");
            for (pval._4_4_ = 3; pval._4_4_ < sStack_28; pval._4_4_ = pval._4_4_ + 1) {
              if (pointer[pval._4_4_] == '\0') {
                Curl_infof(data,", ");
              }
              else if (pointer[pval._4_4_] == '\x01') {
                Curl_infof(data," = ");
              }
              else {
                Curl_infof(data,"%c",(ulong)pointer[pval._4_4_]);
              }
            }
          }
        }
        else {
          for (pval._4_4_ = 2; pval._4_4_ < sStack_28; pval._4_4_ = pval._4_4_ + 1) {
            Curl_infof(data," %.2x",(ulong)pointer[pval._4_4_]);
          }
        }
      }
      if (direction != 0) {
        Curl_infof(data,"\n");
      }
    }
  }
  return;
}

Assistant:

static void printsub(struct SessionHandle *data,
                     int direction,             /* '<' or '>' */
                     unsigned char *pointer,    /* where suboption data is */
                     size_t length)             /* length of suboption data */
{
  unsigned int i = 0;
  unsigned short *pval;

  if(data->set.verbose) {
    if(direction) {
      infof(data, "%s IAC SB ", (direction == '<')? "RCVD":"SENT");
      if(length >= 3) {
        int j;

        i = pointer[length-2];
        j = pointer[length-1];

        if(i != CURL_IAC || j != CURL_SE) {
          infof(data, "(terminated by ");
          if(CURL_TELOPT_OK(i))
            infof(data, "%s ", CURL_TELOPT(i));
          else if(CURL_TELCMD_OK(i))
            infof(data, "%s ", CURL_TELCMD(i));
          else
            infof(data, "%u ", i);
          if(CURL_TELOPT_OK(j))
            infof(data, "%s", CURL_TELOPT(j));
          else if(CURL_TELCMD_OK(j))
            infof(data, "%s", CURL_TELCMD(j));
          else
            infof(data, "%d", j);
          infof(data, ", not IAC SE!) ");
        }
      }
      length -= 2;
    }
    if(length < 1) {
      infof(data, "(Empty suboption?)");
      return;
    }

    if(CURL_TELOPT_OK(pointer[0])) {
      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
      case CURL_TELOPT_NEW_ENVIRON:
      case CURL_TELOPT_NAWS:
        infof(data, "%s", CURL_TELOPT(pointer[0]));
        break;
      default:
        infof(data, "%s (unsupported)", CURL_TELOPT(pointer[0]));
        break;
      }
    }
    else
      infof(data, "%d (unknown)", pointer[i]);

    switch(pointer[0]) {
    case CURL_TELOPT_NAWS:
      pval = (unsigned short*)(pointer+1);
      infof(data, "Width: %hu ; Height: %hu",
            ntohs(pval[0]), ntohs(pval[1]));
      break;
    default:
      switch(pointer[1]) {
      case CURL_TELQUAL_IS:
        infof(data, " IS");
        break;
      case CURL_TELQUAL_SEND:
        infof(data, " SEND");
        break;
      case CURL_TELQUAL_INFO:
        infof(data, " INFO/REPLY");
        break;
      case CURL_TELQUAL_NAME:
        infof(data, " NAME");
        break;
      }

      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
        pointer[length] = 0;
        infof(data, " \"%s\"", &pointer[2]);
        break;
      case CURL_TELOPT_NEW_ENVIRON:
        if(pointer[1] == CURL_TELQUAL_IS) {
          infof(data, " ");
          for(i = 3;i < length;i++) {
            switch(pointer[i]) {
            case CURL_NEW_ENV_VAR:
              infof(data, ", ");
              break;
            case CURL_NEW_ENV_VALUE:
              infof(data, " = ");
              break;
            default:
              infof(data, "%c", pointer[i]);
              break;
            }
          }
        }
        break;
      default:
        for(i = 2; i < length; i++)
          infof(data, " %.2x", pointer[i]);
        break;
      }
    }
    if(direction)
      infof(data, "\n");
  }
}